

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::GpuCounterDescriptor::~GpuCounterDescriptor(GpuCounterDescriptor *this)

{
  GpuCounterDescriptor *this_local;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__GpuCounterDescriptor_009c0ce8;
  ::std::__cxx11::string::~string((string *)&this->unknown_fields_);
  std::
  vector<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterBlock,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterBlock>_>
  ::~vector(&this->blocks_);
  std::
  vector<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterSpec,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterSpec>_>
  ::~vector(&this->specs_);
  protozero::CppMessageObj::~CppMessageObj(&this->super_CppMessageObj);
  return;
}

Assistant:

GpuCounterDescriptor::~GpuCounterDescriptor() = default;